

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<double,_4,_2> * __thiscall
tcu::transpose<double,2,4>
          (Matrix<double,_4,_2> *__return_storage_ptr__,tcu *this,Matrix<double,_2,_4> *mat)

{
  int row;
  long lVar1;
  Vector<double,_4> *pVVar2;
  long lVar3;
  
  Matrix<double,_4,_2>::Matrix(__return_storage_ptr__);
  pVVar2 = (Vector<double,_4> *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<double,_4>,_2> *)pVVar2->m_data)->m_data[0].m_data + lVar3) =
           *(undefined8 *)(this + lVar3 * 2);
    }
    pVVar2 = pVVar2 + 1;
    this = this + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}